

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O2

void pzgeom::TPZGeoQuad::ComputeNormal
               (TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3,TPZVec<double> *result)

{
  double *pdVar1;
  double *pdVar2;
  TPZVec<double> normal;
  TPZVec<double> v1;
  TPZVec<double> v2;
  
  TPZVec<double>::TPZVec(&v1,3);
  TPZVec<double>::TPZVec(&v2,3);
  TPZVec<double>::TPZVec(&normal,3);
  pdVar1 = p1->fStore;
  pdVar2 = p2->fStore;
  *v1.fStore = *pdVar1 - *pdVar2;
  v1.fStore[1] = pdVar1[1] - pdVar2[1];
  v1.fStore[2] = pdVar1[2] - pdVar2[2];
  pdVar1 = p3->fStore;
  *v2.fStore = *pdVar2 - *pdVar1;
  v2.fStore[1] = pdVar2[1] - pdVar1[1];
  v2.fStore[2] = pdVar2[2] - pdVar1[2];
  VectorialProduct(&v1,&v2,&normal);
  VectorialProduct(&v1,&normal,result);
  TPZVec<double>::~TPZVec(&normal);
  TPZVec<double>::~TPZVec(&v2);
  TPZVec<double>::~TPZVec(&v1);
  return;
}

Assistant:

void TPZGeoQuad::ComputeNormal(TPZVec<REAL> &p1, TPZVec<REAL> &p2,TPZVec<REAL> &p3,TPZVec<REAL> &result){
		TPZVec<REAL> v1(3);
		TPZVec<REAL> v2(3);
		TPZVec<REAL> normal(3);
		v1[0]=p1[0]-p2[0];
		v1[1]=p1[1]-p2[1];
		v1[2]=p1[2]-p2[2];
		v2[0]=p2[0]-p3[0];
		v2[1]=p2[1]-p3[1];
		v2[2]=p2[2]-p3[2];
		VectorialProduct(v1,v2,normal);
		VectorialProduct(v1,normal,result);	
	}